

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3BtreeGetMeta(Btree *p,int idx,u32 *pMeta)

{
  BtShared *pBVar1;
  u32 uVar2;
  
  pBVar1 = p->pBt;
  sqlite3BtreeEnter(p);
  if (idx == 0xf) {
    uVar2 = p->iDataVersion + pBVar1->pPager->iDataVersion;
  }
  else {
    uVar2 = sqlite3Get4byte(pBVar1->pPage1->aData + (long)(idx << 2) + 0x24);
  }
  *pMeta = uVar2;
  sqlite3BtreeLeave(p);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3BtreeGetMeta(Btree *p, int idx, u32 *pMeta){
  BtShared *pBt = p->pBt;

  sqlite3BtreeEnter(p);
  assert( p->inTrans>TRANS_NONE );
  assert( SQLITE_OK==querySharedCacheTableLock(p, MASTER_ROOT, READ_LOCK) );
  assert( pBt->pPage1 );
  assert( idx>=0 && idx<=15 );

  if( idx==BTREE_DATA_VERSION ){
    *pMeta = sqlite3PagerDataVersion(pBt->pPager) + p->iDataVersion;
  }else{
    *pMeta = get4byte(&pBt->pPage1->aData[36 + idx*4]);
  }

  /* If auto-vacuum is disabled in this build and this is an auto-vacuum
  ** database, mark the database as read-only.  */
#ifdef SQLITE_OMIT_AUTOVACUUM
  if( idx==BTREE_LARGEST_ROOT_PAGE && *pMeta>0 ){
    pBt->btsFlags |= BTS_READ_ONLY;
  }
#endif

  sqlite3BtreeLeave(p);
}